

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

int floor1_encode(oggpack_buffer *opb,vorbis_block *vb,vorbis_look_floor1 *look,int *post,
                 int *ilogmask)

{
  vorbis_info_floor1 *pvVar1;
  void *pvVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  int local_198;
  int bookas [8];
  int maxval [8];
  int iStack_134;
  uint local_130 [64];
  
  if (post == (int *)0x0) {
    iVar9 = 0;
    oggpack_write(opb,0,1);
    memset(ilogmask,0,(long)(vb->pcmend / 2) << 2);
  }
  else {
    pvVar1 = look->vi;
    lVar15 = (long)look->posts;
    pvVar2 = vb->vd->vi->codec_setup;
    lVar17 = 0;
    if (0 < lVar15) {
      lVar17 = lVar15;
    }
    lVar16 = *(long *)((long)pvVar2 + 0x1328);
    for (lVar22 = 0; lVar17 != lVar22; lVar22 = lVar22 + 1) {
      uVar7 = post[lVar22] & 0x7fff;
      switch(pvVar1->mult) {
      case 1:
        uVar7 = uVar7 >> 2;
        break;
      case 2:
        uVar7 = uVar7 >> 3;
        break;
      case 3:
        uVar7 = uVar7 / 0xc;
        break;
      case 4:
        uVar7 = uVar7 >> 4;
      }
      post[lVar22] = post[lVar22] & 0x8000U | uVar7;
    }
    uVar3 = *(undefined8 *)post;
    for (lVar17 = 0; lVar17 + 2 < lVar15; lVar17 = lVar17 + 1) {
      iVar9 = look->loneighbor[lVar17];
      iVar10 = look->hineighbor[lVar17];
      uVar7 = post[iVar9];
      uVar8 = render_point(pvVar1->postlist[iVar9],pvVar1->postlist[iVar10],uVar7,post[iVar10],
                           pvVar1->postlist[lVar17 + 2]);
      uVar11 = post[lVar17 + 2];
      if (((short)uVar11 < 0) || (uVar11 == uVar8)) {
        post[lVar17 + 2] = uVar8 | 0x8000;
        local_130[lVar17] = 0;
      }
      else {
        uVar13 = look->quant_q - uVar8;
        if ((int)uVar8 <= (int)uVar13) {
          uVar13 = uVar8;
        }
        uVar11 = uVar11 - uVar8;
        if ((int)uVar11 < 0) {
          if (SBORROW4(uVar11,-uVar13) != (int)(uVar11 + uVar13) < 0) {
            uVar11 = ~uVar11;
            goto LAB_001bfd67;
          }
          uVar13 = ~(uVar11 * 2);
        }
        else if ((int)uVar11 < (int)uVar13) {
          uVar13 = uVar11 * 2;
        }
        else {
LAB_001bfd67:
          uVar13 = uVar13 + uVar11;
        }
        local_130[lVar17] = uVar13;
        post[iVar9] = uVar7 & 0x7fff;
        post[iVar10] = post[iVar10] & 0x7fff;
      }
    }
    oggpack_write(opb,1,1);
    look->frames = look->frames + 1;
    iVar9 = ov_ilog(look->quant_q - 1);
    look->postbits = look->postbits + (long)(iVar9 * 2);
    local_198 = (int)uVar3;
    iVar9 = ov_ilog(look->quant_q - 1);
    oggpack_write(opb,(long)local_198,iVar9);
    iStack_134 = (int)((ulong)uVar3 >> 0x20);
    iVar9 = ov_ilog(look->quant_q - 1);
    oggpack_write(opb,(long)iStack_134,iVar9);
    lVar17 = 2;
    for (lVar15 = 0; lVar15 < pvVar1->partitions; lVar15 = lVar15 + 1) {
      iVar9 = pvVar1->partitionclass[lVar15];
      uVar7 = pvVar1->class_dim[iVar9];
      iVar10 = pvVar1->class_subs[iVar9];
      bookas[4] = 0;
      bookas[5] = 0;
      bookas[6] = 0;
      bookas[7] = 0;
      bookas[0] = 0;
      bookas[1] = 0;
      bookas[2] = 0;
      bookas[3] = 0;
      if (iVar10 == 0) {
        uVar20 = 0;
        if (0 < (int)uVar7) {
          uVar20 = (ulong)uVar7;
        }
      }
      else {
        bVar4 = (byte)iVar10 & 0x1f;
        maxval[4] = 0;
        maxval[5] = 0;
        maxval[6] = 0;
        maxval[7] = 0;
        maxval[0] = 0;
        maxval[1] = 0;
        maxval[2] = 0;
        maxval[3] = 0;
        uVar11 = 1 << bVar4;
        if (1 << bVar4 < 1) {
          uVar11 = 0;
        }
        for (uVar20 = 0; uVar11 != uVar20; uVar20 = uVar20 + 1) {
          lVar22 = (long)pvVar1->class_subbook[iVar9][uVar20];
          iVar12 = 1;
          if (-1 < lVar22) {
            iVar12 = *(int *)(*(long *)((long)pvVar2 + lVar22 * 8 + 0xb28) + 8);
          }
          maxval[uVar20] = iVar12;
        }
        uVar21 = 0;
        uVar20 = 0;
        if (0 < (int)uVar7) {
          uVar20 = (ulong)uVar7;
        }
        uVar8 = 0;
        iVar12 = 0;
        for (; uVar21 != uVar20; uVar21 = uVar21 + 1) {
          for (uVar23 = 0; uVar11 != uVar23; uVar23 = uVar23 + 1) {
            if ((int)local_130[uVar21 + lVar17 + -2] < maxval[uVar23]) {
              bookas[uVar21] = (int)uVar23;
              goto LAB_001bff2f;
            }
          }
          uVar23 = (ulong)(uint)bookas[uVar21];
LAB_001bff2f:
          uVar8 = uVar8 | (int)uVar23 << ((byte)iVar12 & 0x1f);
          iVar12 = iVar12 + iVar10;
        }
        iVar10 = vorbis_book_encode((codebook *)((long)pvVar1->class_book[iVar9] * 0x60 + lVar16),
                                    uVar8,opb);
        look->phrasebits = look->phrasebits + (long)iVar10;
      }
      for (uVar21 = 0; uVar20 != uVar21; uVar21 = uVar21 + 1) {
        lVar22 = (long)pvVar1->class_subbook[iVar9][bookas[uVar21]];
        if (-1 < lVar22) {
          lVar22 = lVar22 * 0x60;
          if ((long)(int)local_130[lVar17 + (uVar21 - 2)] < *(long *)(lVar16 + 8 + lVar22)) {
            iVar10 = vorbis_book_encode((codebook *)(lVar22 + lVar16),
                                        local_130[lVar17 + (uVar21 - 2)],opb);
            look->postbits = look->postbits + (long)iVar10;
          }
        }
      }
      lVar17 = lVar17 + (int)uVar7;
    }
    iVar12 = pvVar1->mult * *post;
    lVar17 = *(long *)((long)pvVar2 + vb->W * 8);
    iVar10 = 0;
    iVar9 = 0;
    for (lVar15 = 1; lVar15 < look->posts; lVar15 = lVar15 + 1) {
      iVar24 = iVar12;
      if ((uint)post[look->forward_index[lVar15]] < 0x8000) {
        iVar24 = post[look->forward_index[lVar15]] * pvVar1->mult;
        iVar10 = pvVar1->postlist[look->forward_index[lVar15]];
        iVar19 = iVar24 - iVar12;
        iVar25 = iVar10 - iVar9;
        iVar5 = -iVar19;
        if (0 < iVar19) {
          iVar5 = iVar19;
        }
        iVar14 = (iVar19 / iVar25) * iVar25;
        iVar6 = -iVar14;
        if (iVar14 < 1) {
          iVar6 = iVar14;
        }
        iVar18 = (int)(lVar17 / 2);
        iVar14 = iVar10;
        if (iVar18 < iVar10) {
          iVar14 = iVar18;
        }
        lVar16 = (long)iVar9;
        if (iVar9 < iVar14) {
          ilogmask[lVar16] = iVar12;
        }
        iVar18 = 0;
        while (lVar16 = lVar16 + 1, iVar9 = iVar10, lVar16 < iVar14) {
          iVar18 = iVar18 + iVar5 + iVar6;
          iVar9 = 0;
          uVar7 = 0;
          if (iVar25 <= iVar18) {
            iVar9 = iVar25;
            uVar7 = iVar19 >> 0x1f | 1;
          }
          iVar18 = iVar18 - iVar9;
          iVar12 = iVar12 + iVar19 / iVar25 + uVar7;
          ilogmask[lVar16] = iVar12;
        }
      }
      iVar12 = iVar24;
    }
    iVar9 = 1;
    for (lVar17 = (long)iVar10; lVar17 < vb->pcmend / 2; lVar17 = lVar17 + 1) {
      ilogmask[lVar17] = iVar12;
    }
  }
  return iVar9;
}

Assistant:

int floor1_encode(oggpack_buffer *opb,vorbis_block *vb,
                  vorbis_look_floor1 *look,
                  int *post,int *ilogmask){

  long i,j;
  vorbis_info_floor1 *info=look->vi;
  long posts=look->posts;
  codec_setup_info *ci=vb->vd->vi->codec_setup;
  int out[VIF_POSIT+2];
  static_codebook **sbooks=ci->book_param;
  codebook *books=ci->fullbooks;

  /* quantize values to multiplier spec */
  if(post){
    for(i=0;i<posts;i++){
      int val=post[i]&0x7fff;
      switch(info->mult){
      case 1: /* 1024 -> 256 */
        val>>=2;
        break;
      case 2: /* 1024 -> 128 */
        val>>=3;
        break;
      case 3: /* 1024 -> 86 */
        val/=12;
        break;
      case 4: /* 1024 -> 64 */
        val>>=4;
        break;
      }
      post[i]=val | (post[i]&0x8000);
    }

    out[0]=post[0];
    out[1]=post[1];

    /* find prediction values for each post and subtract them */
    for(i=2;i<posts;i++){
      int ln=look->loneighbor[i-2];
      int hn=look->hineighbor[i-2];
      int x0=info->postlist[ln];
      int x1=info->postlist[hn];
      int y0=post[ln];
      int y1=post[hn];

      int predicted=render_point(x0,x1,y0,y1,info->postlist[i]);

      if((post[i]&0x8000) || (predicted==post[i])){
        post[i]=predicted|0x8000; /* in case there was roundoff jitter
                                     in interpolation */
        out[i]=0;
      }else{
        int headroom=(look->quant_q-predicted<predicted?
                      look->quant_q-predicted:predicted);

        int val=post[i]-predicted;

        /* at this point the 'deviation' value is in the range +/- max
           range, but the real, unique range can always be mapped to
           only [0-maxrange).  So we want to wrap the deviation into
           this limited range, but do it in the way that least screws
           an essentially gaussian probability distribution. */

        if(val<0)
          if(val<-headroom)
            val=headroom-val-1;
          else
            val=-1-(val<<1);
        else
          if(val>=headroom)
            val= val+headroom;
          else
            val<<=1;

        out[i]=val;
        post[ln]&=0x7fff;
        post[hn]&=0x7fff;
      }
    }

    /* we have everything we need. pack it out */
    /* mark nontrivial floor */
    oggpack_write(opb,1,1);

    /* beginning/end post */
    look->frames++;
    look->postbits+=ov_ilog(look->quant_q-1)*2;
    oggpack_write(opb,out[0],ov_ilog(look->quant_q-1));
    oggpack_write(opb,out[1],ov_ilog(look->quant_q-1));


    /* partition by partition */
    for(i=0,j=2;i<info->partitions;i++){
      int class=info->partitionclass[i];
      int cdim=info->class_dim[class];
      int csubbits=info->class_subs[class];
      int csub=1<<csubbits;
      int bookas[8]={0,0,0,0,0,0,0,0};
      int cval=0;
      int cshift=0;
      int k,l;

      /* generate the partition's first stage cascade value */
      if(csubbits){
        int maxval[8]={0,0,0,0,0,0,0,0}; /* gcc's static analysis
                                            issues a warning without
                                            initialization */
        for(k=0;k<csub;k++){
          int booknum=info->class_subbook[class][k];
          if(booknum<0){
            maxval[k]=1;
          }else{
            maxval[k]=sbooks[info->class_subbook[class][k]]->entries;
          }
        }
        for(k=0;k<cdim;k++){
          for(l=0;l<csub;l++){
            int val=out[j+k];
            if(val<maxval[l]){
              bookas[k]=l;
              break;
            }
          }
          cval|= bookas[k]<<cshift;
          cshift+=csubbits;
        }
        /* write it */
        look->phrasebits+=
          vorbis_book_encode(books+info->class_book[class],cval,opb);

#ifdef TRAIN_FLOOR1
        {
          FILE *of;
          char buffer[80];
          sprintf(buffer,"line_%dx%ld_class%d.vqd",
                  vb->pcmend/2,posts-2,class);
          of=fopen(buffer,"a");
          fprintf(of,"%d\n",cval);
          fclose(of);
        }
#endif
      }

      /* write post values */
      for(k=0;k<cdim;k++){
        int book=info->class_subbook[class][bookas[k]];
        if(book>=0){
          /* hack to allow training with 'bad' books */
          if(out[j+k]<(books+book)->entries)
            look->postbits+=vorbis_book_encode(books+book,
                                               out[j+k],opb);
          /*else
            fprintf(stderr,"+!");*/

#ifdef TRAIN_FLOOR1
          {
            FILE *of;
            char buffer[80];
            sprintf(buffer,"line_%dx%ld_%dsub%d.vqd",
                    vb->pcmend/2,posts-2,class,bookas[k]);
            of=fopen(buffer,"a");
            fprintf(of,"%d\n",out[j+k]);
            fclose(of);
          }
#endif
        }
      }
      j+=cdim;
    }

    {
      /* generate quantized floor equivalent to what we'd unpack in decode */
      /* render the lines */
      int hx=0;
      int lx=0;
      int ly=post[0]*info->mult;
      int n=ci->blocksizes[vb->W]/2;

      for(j=1;j<look->posts;j++){
        int current=look->forward_index[j];
        int hy=post[current]&0x7fff;
        if(hy==post[current]){

          hy*=info->mult;
          hx=info->postlist[current];

          render_line0(n,lx,hx,ly,hy,ilogmask);

          lx=hx;
          ly=hy;
        }
      }
      for(j=hx;j<vb->pcmend/2;j++)ilogmask[j]=ly; /* be certain */
      return(1);
    }
  }else{
    oggpack_write(opb,0,1);
    memset(ilogmask,0,vb->pcmend/2*sizeof(*ilogmask));
    return(0);
  }
}